

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::AddItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  string *config;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  bool bVar1;
  bool bVar2;
  __type _Var3;
  TargetType TVar4;
  string_view suffix;
  string_view str;
  string_view str_00;
  cmGeneratorTarget *tgt;
  allocator<char> local_1ad;
  ItemIsPath local_1ac;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> lib;
  LinkEntry libEntry;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_118;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_108;
  string local_f8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  FeatureDescriptor *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_80;
  string local_50;
  
  this_00 = entry->Target;
  tgt = this_00;
  if (this_00 != (cmGeneratorTarget *)0x0) {
    config = &this->Config;
    bVar1 = cmGeneratorTarget::IsExecutableWithExports(this_00);
    if (((bVar1) && (bVar2 = cmGeneratorTarget::HasImportLibrary(this_00,config), !bVar2)) &&
       ((this->LoaderFlag).Value == (string *)0x0)) {
      return;
    }
    bVar2 = cmGeneratorTarget::IsLinkable(this_00);
    if (bVar2) {
      if (bVar1 && (this->LoaderFlag).Value != (string *)0x0) {
        bVar1 = cmGeneratorTarget::HasImportLibrary(this_00,config);
        cmGeneratorTarget::GetFullPath(&lib.Value,this_00,config,(uint)bVar1,true);
        std::__cxx11::string::string((string *)&local_a0,(string *)&lib);
        std::
        __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_108,
                       (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        *)&(entry->Item).Backtrace);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&libEntry.Item,&local_a0,(cmListFileBacktrace *)&local_108);
        local_1ac = Yes;
        _Var3 = std::operator==(&entry->Feature,&cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_
                               );
        if (_Var3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,"__CMAKE_LINK_EXECUTABLE",&local_1ad);
        }
        else {
          std::__cxx11::string::string((string *)&local_f8,(string *)&entry->Feature);
        }
        local_a8 = FindLibraryFeature(this,&local_f8);
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,&libEntry.Item,&local_1ac,&tgt,&local_a8);
        std::__cxx11::string::~string((string *)&local_f8);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&libEntry.Item);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
        std::__cxx11::string::~string((string *)&local_a0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->Depends,&lib.Value);
      }
      else {
        TVar4 = cmGeneratorTarget::GetType(this_00);
        if (TVar4 != INTERFACE_LIBRARY) {
          TVar4 = cmGeneratorTarget::GetType(this_00);
          if (TVar4 != OBJECT_LIBRARY) {
            bVar1 = cmGeneratorTarget::HasImportLibrary(this_00,config);
            cmGeneratorTarget::GetFullPath(&local_50,this_00,config,(uint)bVar1,true);
            std::
            __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ::__shared_ptr(&local_d8,
                           (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            *)&(entry->Item).Backtrace);
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                      (&lib,&local_50,(cmListFileBacktrace *)&local_d8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
            std::__cxx11::string::~string((string *)&local_50);
            bVar2 = cmTarget::IsAIX(tgt->Target);
            if ((!bVar2) ||
               (str_00._M_str._4_4_ = lib.Value._M_dataplus._M_p._4_4_,
               str_00._M_str._0_4_ = lib.Value._M_dataplus._M_p._0_4_,
               str_00._M_len = lib.Value._M_string_length,
               bVar2 = cmHasLiteralSuffix<10ul>(str_00,(char (*) [10])0x616126), !bVar1 || !bVar2))
            {
              if ((this->LinkDependsNoShared != true) ||
                 (TVar4 = cmGeneratorTarget::GetType(tgt), TVar4 != SHARED_LIBRARY)) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&this->Depends,&lib.Value);
              }
              cmComputeLinkDepends::LinkEntry::LinkEntry(&libEntry,entry);
              BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
              operator=(&libEntry.Item,&lib);
              AddTargetItem(this,&libEntry);
              AddLibraryRuntimeInfo(this,&lib.Value,tgt);
              if (((tgt != (cmGeneratorTarget *)0x0) &&
                  (TVar4 = cmGeneratorTarget::GetType(tgt), TVar4 == SHARED_LIBRARY)) &&
                 (bVar1 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar1)) {
                AddRuntimeDLL(this,tgt);
              }
              cmComputeLinkDepends::LinkEntry::~LinkEntry(&libEntry);
            }
            BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BT(&lib);
            return;
          }
          return;
        }
        libEntry.Item.Value._M_dataplus._M_p = (pointer)&libEntry.Item.Value.field_2;
        libEntry.Item.Value._M_string_length = 0;
        libEntry.Item.Value.field_2._M_local_buf[0] = '\0';
        lib.Value._M_dataplus._M_p._0_4_ = 0;
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &libEntry,(ItemIsPath *)&lib,&tgt);
        std::__cxx11::string::~string((string *)&libEntry);
        cmGeneratorTarget::GetImportedLibName(&lib.Value,tgt,config);
        if (lib.Value._M_string_length != 0) {
          std::__cxx11::string::string((string *)&local_c8,(string *)&lib);
          std::
          __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_118,
                         (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)&(entry->Item).Backtrace);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&local_80,&local_c8,(cmListFileBacktrace *)&local_118);
          cmComputeLinkDepends::LinkEntry::LinkEntry(&libEntry,&local_80,(cmGeneratorTarget *)0x0);
          AddItem(this,&libEntry);
          cmComputeLinkDepends::LinkEntry::~LinkEntry(&libEntry);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&local_80);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
          std::__cxx11::string::~string((string *)&local_c8);
        }
      }
      std::__cxx11::string::~string((string *)&lib);
      return;
    }
  }
  suffix._M_str = "FRAMEWORK";
  suffix._M_len = 9;
  str._M_str = (entry->Feature)._M_dataplus._M_p;
  str._M_len = (entry->Feature)._M_string_length;
  bVar1 = cmHasSuffix(str,suffix);
  if (bVar1) {
LAB_00382eae:
    AddFrameworkItem(this,entry);
  }
  else {
    _Var3 = std::operator==(&entry->Feature,&cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_);
    if ((_Var3) && (bVar1 = cmSystemTools::IsPathToFramework((string *)entry), bVar1)) {
      this_01 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&libEntry,"APPLE",(allocator<char> *)&lib);
      bVar1 = cmMakefile::IsOn(this_01,(string *)&libEntry);
      std::__cxx11::string::~string((string *)&libEntry);
      if (bVar1) goto LAB_00382eae;
    }
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)entry);
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileIsDirectory((string *)entry);
      if (bVar1) {
        DropDirectoryItem(this,&entry->Item);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Depends,(value_type *)entry);
        AddFullItem(this,entry);
        AddLibraryRuntimeInfo(this,(string *)entry);
      }
    }
    else {
      AddUserItem(this,entry,true);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(LinkEntry const& entry)
{
  cmGeneratorTarget const* tgt = entry.Target;
  BT<std::string> const& item = entry.Item;

  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !tgt->HasImportLibrary(config) && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now using a special feature.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;
      std::string exe = tgt->GetFullPath(config, artifact, true);
      this->Items.emplace_back(
        BT<std::string>(exe, item.Backtrace), ItemIsPath::Yes, tgt,
        this->FindLibraryFeature(entry.Feature == DEFAULT
                                   ? "__CMAKE_LINK_EXECUTABLE"
                                   : entry.Feature));
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), ItemIsPath::No, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(BT<std::string>(libName, item.Backtrace));
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      // Ignore object library!
      // Its object-files should already have been extracted for linking.
    } else {
      // Decide whether to use an import library.
      cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(config)
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      BT<std::string> lib = BT<std::string>(
        tgt->GetFullPath(config, artifact, true), item.Backtrace);
      if (tgt->Target->IsAIX() && cmHasLiteralSuffix(lib.Value, "-NOTFOUND") &&
          artifact == cmStateEnums::ImportLibraryArtifact) {
        // This is an imported executable on AIX that has ENABLE_EXPORTS
        // but not IMPORTED_IMPLIB.  CMake used to produce and accept such
        // imported executables on AIX before we taught it to use linker
        // import files.  For compatibility, simply skip linking to this
        // executable as we did before.  It works with runtime linking.
        return;
      }
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib.Value);
      }

      LinkEntry libEntry{ entry };
      libEntry.Item = lib;
      this->AddTargetItem(libEntry);
      this->AddLibraryRuntimeInfo(lib.Value, tgt);
      if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
          this->Target->IsDLLPlatform()) {
        this->AddRuntimeDLL(tgt);
      }
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s) ||
        (entry.Feature == DEFAULT &&
         cmSystemTools::IsPathToFramework(item.Value) &&
         this->Makefile->IsOn("APPLE"))) {
      // This is a framework.
      this->AddFrameworkItem(entry);
    } else if (cmSystemTools::FileIsFullPath(item.Value)) {
      if (cmSystemTools::FileIsDirectory(item.Value)) {
        // This is a directory.
        this->DropDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item.Value);
        this->AddFullItem(entry);
        this->AddLibraryRuntimeInfo(item.Value);
      }
    } else {
      // This is a library or option specified by the user.
      this->AddUserItem(entry, true);
    }
  }
}